

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::initTest(TextureCubeMapArrayStencilAttachments *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  NotSupportedError *pNVar5;
  long lVar6;
  GLfloat vertices [16];
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 uStack_30;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported == false) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Texture cube map array functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
               ,0x2c3);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) &&
     (this->m_fbo_layered != '\0')) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Geometry shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_68);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  puVar4 = (undefined8 *)operator_new__(0x68);
  *puVar4 = 4;
  lVar6 = 8;
  do {
    *(undefined8 *)((long)puVar4 + lVar6) = 0;
    ((undefined8 *)((long)puVar4 + lVar6))[1] = 0;
    *(undefined4 *)((long)puVar4 + lVar6 + 0x10) = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x68);
  this->m_cube_map_array_data = (CubeMapArrayDataStorage *)(puVar4 + 1);
  CubeMapArrayDataStorage::init((CubeMapArrayDataStorage *)(puVar4 + 1),(EVP_PKEY_CTX *)0x40);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data + 1,(EVP_PKEY_CTX *)0x75);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data + 2,(EVP_PKEY_CTX *)0x100);
  CubeMapArrayDataStorage::init(this->m_cube_map_array_data + 3,(EVP_PKEY_CTX *)0xad);
  local_38 = &DAT_3f8000003f800000;
  uStack_30 = 0x3f80000000000000;
  local_48 = 0xbf8000003f800000;
  uStack_40 = 0x3f80000000000000;
  local_68.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_68.field_2._8_8_ = 0x3f80000000000000;
  local_68._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_68._M_string_length._0_4_ = 0;
  local_68._M_string_length._4_4_ = 0x3f800000;
  (**(code **)(lVar3 + 0x708))(1,&this->m_vao_id);
  (**(code **)(lVar3 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not create vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2dd);
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_vbo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not generate buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2e0);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_vbo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2e3);
  (**(code **)(lVar3 + 0x150))(0x8892,0x40,&local_68,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not set data for buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2e6);
  (**(code **)(lVar3 + 0x6d0))(1,&this->m_fbo_read_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not generate framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2ea);
  (**(code **)(lVar3 + 0x6d0))(1,&this->m_fbo_draw_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not generate framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2ed);
  (**(code **)(lVar3 + 0x5e0))(0xb90);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not enable stencil test!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2f0);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::initTest(void)
{
	/* Check if EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}
	if (!m_is_geometry_shader_extension_supported && m_fbo_layered)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create 4 different configurations of cube map array texture */
	m_cube_map_array_data = new CubeMapArrayDataStorage[m_n_cube_map_array_configurations];

	m_cube_map_array_data[0].init(64, 64, 18);
	m_cube_map_array_data[1].init(117, 117, 6);
	m_cube_map_array_data[2].init(256, 256, 6);
	m_cube_map_array_data[3].init(173, 173, 12);

	/* full screen square */
	glw::GLfloat vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
								1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");

	gl.genBuffers(1, &m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate buffer object!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set data for buffer object!");

	/* Create and configure framebuffer object */
	gl.genFramebuffers(1, &m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate framebuffer object!");

	gl.genFramebuffers(1, &m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate framebuffer object!");

	gl.enable(GL_STENCIL_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable stencil test!");
}